

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::basic_format_specs<char>::basic_format_specs(basic_format_specs<char> *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0xffffffff;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(byte *)((long)in_RDI + 9) = *(byte *)((long)in_RDI + 9) & 0xf0;
  *(byte *)((long)in_RDI + 9) = *(byte *)((long)in_RDI + 9) & 0x8f;
  *(byte *)((long)in_RDI + 9) = *(byte *)((long)in_RDI + 9) & 0x7f;
  detail::fill_t<char>::fill_t((fill_t<char> *)((long)in_RDI + 10));
  return;
}

Assistant:

constexpr basic_format_specs()
      : width(0),
        precision(-1),
        type(0),
        align(align::none),
        sign(sign::none),
        alt(false) {}